

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O0

void __thiscall layer::Convolution2D::backPropagate(Convolution2D *this)

{
  longdouble *plVar1;
  undefined1 auVar2 [16];
  Convolution2D *pCVar3;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar4;
  undefined6 in_stack_ffffffffffffffb2;
  int local_38;
  int local_34;
  int i_1;
  int posXKernel;
  int posYKernel;
  int posZKernel;
  int posXOut;
  int posYOut;
  int posZOut;
  int i;
  int posYIn;
  int posXIn;
  Convolution2D *this_local;
  
  for (posYOut = 0; posYOut < (this->super_Layer)._sizeZWeight * this->_sizeYIn * this->_sizeYIn;
      posYOut = posYOut + 1) {
    (**(this->super_Layer)._deltaIn)[posYOut] = (longdouble)0;
  }
  pCVar3 = this;
  for (posXOut = 0; posXOut < (this->super_Layer)._sizeZOut; posXOut = posXOut + 1) {
    for (posZKernel = 0; posZKernel < (this->super_Layer)._sizeYOut; posZKernel = posZKernel + 1) {
      for (posYKernel = 0; posYKernel < (this->super_Layer)._sizeXOut; posYKernel = posYKernel + 1)
      {
        for (posXKernel = 0; posXKernel < (this->super_Layer)._sizeZWeight;
            posXKernel = posXKernel + 1) {
          posZOut = posZKernel * this->_stepY - this->_zeroPaddingY;
          for (i_1 = 0; i_1 < (this->super_Layer)._sizeYWeight; i_1 = i_1 + 1) {
            if (-1 < posZOut && posZOut < this->_sizeYIn) {
              i = posYKernel * this->_stepX - this->_zeroPaddingX;
              for (local_34 = 0; local_34 < (this->super_Layer)._sizeXWeight;
                  local_34 = local_34 + 1) {
                if (-1 < i && i < this->_sizeYIn) {
                  pCVar3 = (Convolution2D *)((long)posYKernel * 0x10);
                  plVar1 = (this->super_Layer)._deltaIn[posXKernel][posZOut];
                  plVar1[i] = (this->super_Layer)._delta[posXOut][posZKernel][posYKernel] *
                              (this->super_Layer)._ptrWeight[posXOut][posXKernel][i_1][local_34] +
                              plVar1[i];
                  in_ST5 = in_ST4;
                  in_ST6 = in_ST4;
                }
                i = i + 1;
              }
            }
            posZOut = posZOut + 1;
          }
        }
      }
    }
  }
  for (local_38 = 0; local_38 < (this->super_Layer)._sizeZWeight * this->_sizeYIn * this->_sizeYIn;
      local_38 = local_38 + 1) {
    auVar2._10_6_ = in_stack_ffffffffffffffb2;
    auVar2._0_10_ = (**(this->super_Layer)._deltaIn)[local_38];
    lVar4 = in_ST6;
    (*(this->super_Layer)._fDerivative)((scalar *)pCVar3,(scalar)auVar2);
    (**(this->super_Layer)._deltaIn)[local_38] = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = lVar4;
  }
  return;
}

Assistant:

void Convolution2D::backPropagate()
    {
        int posXIn = 0;
        int posYIn = 0;

        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = 0;

        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _deltaIn[posZKernel][posYIn][posXIn] +=
                                                _delta[posZOut][posYOut][posXOut] *
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                }
            }
        }


        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = _fDerivative((**_deltaIn)[i]);
    }